

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall
RangeLock_InitialState_Test::~RangeLock_InitialState_Test(RangeLock_InitialState_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RangeLock, InitialState) {
    pstore::file::range_lock lock;
    EXPECT_EQ (nullptr, lock.file ());
    EXPECT_EQ (UINT64_C (0), lock.offset ());
    EXPECT_EQ (std::size_t{0}, lock.size ());
    EXPECT_EQ (mock_file::lock_kind::shared_read, lock.kind ());
    EXPECT_FALSE (lock.is_locked ());
}